

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool loadfirstvalue_largeorequal(roaring_uint32_iterator_t *newit,uint32_t val)

{
  array_container_t *arr;
  run_container_t *arr_00;
  int iVar1;
  run_container_t *rc;
  array_container_t *ac;
  bitset_container_t *bc;
  uint16_t lb;
  uint32_t val_local;
  roaring_uint32_iterator_t *newit_local;
  
  iter_new_container_partial_init(newit);
  bc._4_2_ = (ushort)val;
  if (newit->typecode == '\x01') {
    iVar1 = bitset_container_index_equalorlarger((bitset_container_t *)newit->container,bc._4_2_);
    newit->in_container_index = iVar1;
    newit->current_value = newit->highbits | newit->in_container_index;
  }
  else if (newit->typecode == '\x02') {
    arr = (array_container_t *)newit->container;
    iVar1 = array_container_index_equalorlarger(arr,bc._4_2_);
    newit->in_container_index = iVar1;
    newit->current_value = newit->highbits | (uint)arr->array[newit->in_container_index];
  }
  else {
    arr_00 = (run_container_t *)newit->container;
    iVar1 = run_container_index_equalorlarger(arr_00,bc._4_2_);
    newit->run_index = iVar1;
    if (bc._4_2_ < arr_00->runs[newit->run_index].value) {
      newit->current_value = newit->highbits | (uint)arr_00->runs[newit->run_index].value;
    }
    else {
      newit->current_value = val;
    }
  }
  return true;
}

Assistant:

static bool loadfirstvalue_largeorequal(roaring_uint32_iterator_t *newit, uint32_t val) {
    // Don't have to check return value because of prerequisite
    iter_new_container_partial_init(newit);
    uint16_t lb = val & 0xFFFF;

    switch (newit->typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(newit->container);
            newit->in_container_index =
                        bitset_container_index_equalorlarger(bc, lb);
            newit->current_value = newit->highbits | newit->in_container_index;
            break; }

        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(newit->container);
            newit->in_container_index =
                        array_container_index_equalorlarger(ac, lb);
            newit->current_value =
                        newit->highbits | ac->array[newit->in_container_index];
            break; }

        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(newit->container);
            newit->run_index = run_container_index_equalorlarger(rc, lb);
            if (rc->runs[newit->run_index].value <= lb) {
                newit->current_value = val;
            } else {
                newit->current_value =
                        newit->highbits | rc->runs[newit->run_index].value;
            }
            break; }

        default:
            __builtin_unreachable();
    }

    return true;
}